

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegenerator.h
# Opt level: O2

void __thiscall CodeGenerator::writeBeginningOfClass(CodeGenerator *this,ostream *s,Class *clazz)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(s,"class ");
  poVar1 = std::operator<<(poVar1,(string *)clazz);
  poVar1 = std::operator<<(poVar1," : public rengine::SignalEmitter");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"{");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"public:");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"    bool initialized = false;");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"    // initialize function..");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"    void initialize(rengine::ResourceManager *manager)");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"    {");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"        assert(!initialized);");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"        initResources(manager);");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"        initObjects();");
  std::endl<char,std::char_traits<char>>(poVar1);
  if ((clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (clazz->replicators).super__Vector_base<Replicator,_std::allocator<Replicator>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar1 = std::operator<<(s,"        initReplicators(manager);");
    std::endl<char,std::char_traits<char>>(poVar1);
  }
  poVar1 = std::operator<<(s,"        initialized = true;");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(poVar1,"    }");
  poVar1 = std::endl<char,std::char_traits<char>>(poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void CodeGenerator::writeBeginningOfClass(std::ostream &s, Class *clazz)
{
    s << "class " << clazz->name << " : public rengine::SignalEmitter" << std::endl
      << "{" << std::endl
      << "public:" << std::endl
      << "    bool initialized = false;" << std::endl
      << "    // initialize function.." << std::endl
      << "    void initialize(rengine::ResourceManager *manager)" << std::endl
      << "    {" << std::endl
      << "        assert(!initialized);" << std::endl
      << "        initResources(manager);" << std::endl
      << "        initObjects();" << std::endl;
    if (!clazz->replicators.empty())
        s << "        initReplicators(manager);" << std::endl;
    s << "        initialized = true;" << std::endl
      << "    }" << std::endl
      << std::endl;
}